

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O1

QueueElement * __thiscall
MeCab::FreeList<MeCab::NBestGenerator::QueueElement>::alloc
          (FreeList<MeCab::NBestGenerator::QueueElement> *this)

{
  pointer *pppQVar1;
  ulong uVar2;
  iterator __position;
  size_t sVar3;
  QueueElement *pQVar4;
  QueueElement *local_18;
  
  uVar2 = this->size;
  if (this->pi_ == uVar2) {
    this->li_ = this->li_ + 1;
    this->pi_ = 0;
  }
  __position._M_current =
       (this->freeList).
       super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (this->li_ ==
      (long)__position._M_current -
      (long)(this->freeList).
            super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3) {
    local_18 = (QueueElement *)operator_new__(-(ulong)(uVar2 >> 0x3b != 0) | uVar2 << 5);
    if (__position._M_current ==
        (this->freeList).
        super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<MeCab::NBestGenerator::QueueElement*,std::allocator<MeCab::NBestGenerator::QueueElement*>>
      ::_M_realloc_insert<MeCab::NBestGenerator::QueueElement*>
                ((vector<MeCab::NBestGenerator::QueueElement*,std::allocator<MeCab::NBestGenerator::QueueElement*>>
                  *)&this->freeList,__position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      pppQVar1 = &(this->freeList).
                  super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppQVar1 = *pppQVar1 + 1;
    }
  }
  sVar3 = this->pi_;
  pQVar4 = (this->freeList).
           super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
           ._M_impl.super__Vector_impl_data._M_start[this->li_];
  this->pi_ = sVar3 + 1;
  return pQVar4 + sVar3;
}

Assistant:

T* alloc() {
    if (pi_ == size) {
      li_++;
      pi_ = 0;
    }
    if (li_ == freeList.size()) freeList.push_back(new T[size]);
    return freeList[li_] + (pi_++);
  }